

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedField<unsigned_int>::Add(RepeatedField<unsigned_int> *this,uint *value)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  uint tmp;
  
  uVar1 = this->current_size_;
  uVar2 = *value;
  if (uVar1 == this->total_size_) {
    Reserve(this,this->total_size_ + 1);
  }
  puVar3 = elements(this);
  puVar3[uVar1] = uVar2;
  this->current_size_ = uVar1 + 1;
  return;
}

Assistant:

inline void RepeatedField<Element>::Add(const Element& value) {
  uint32_t size = current_size_;
  if (static_cast<int>(size) == total_size_) {
    // value could reference an element of the array. Reserving new space will
    // invalidate the reference. So we must make a copy first.
    auto tmp = value;
    Reserve(total_size_ + 1);
    elements()[size] = std::move(tmp);
  } else {
    elements()[size] = value;
  }
  current_size_ = size + 1;
}